

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O3

void __thiscall FIX::FieldMap::addGroupPtr(FieldMap *this,int field,FieldMap *group,bool setCount)

{
  iterator __position;
  vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>> *this_00;
  int local_8c;
  FieldMap *local_88;
  FieldBase local_80;
  
  if (group != (FieldMap *)0x0) {
    local_8c = field;
    local_88 = group;
    this_00 = (vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>> *)
              std::
              map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
              ::operator[](&this->m_groups,&local_8c);
    __position._M_current = *(FieldMap ***)(this_00 + 8);
    if (__position._M_current == *(FieldMap ***)(this_00 + 0x10)) {
      std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>::
      _M_realloc_insert<FIX::FieldMap*const&>(this_00,__position,&local_88);
    }
    else {
      *__position._M_current = group;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
    }
    if (setCount) {
      IntField::IntField((IntField *)&local_80,local_8c,
                         (int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 3));
      setField(this,&local_80,true);
      FieldBase::~FieldBase(&local_80);
    }
  }
  return;
}

Assistant:

void FieldMap::addGroupPtr( int field, FieldMap * group, bool setCount )
{
    if( group == 0 )
        return;

    std::vector< FieldMap* >& vec = m_groups[ field ];
    vec.push_back( group );

    if( setCount )
        setField( IntField( field, (int)vec.size() ) );
}